

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O3

bool __thiscall DLoadSaveMenu::MouseEvent(DLoadSaveMenu *this,int type,int x,int y)

{
  bool bVar1;
  int iVar2;
  
  if ((this->listboxLeft <= x) && (x < this->listboxLeft + this->listboxWidth)) {
    iVar2 = this->listboxTop;
    if ((iVar2 <= y) &&
       ((y < iVar2 + this->listboxHeight &&
        (iVar2 = (y - iVar2) / this->rowHeight + this->TopItem, iVar2 < (int)SaveGames.Count)))) {
      this->Selected = iVar2;
      UnloadSaveData(this);
      ExtractSaveData(this,this->Selected);
      if (type == 2) {
        iVar2 = (*(this->super_DListMenu).super_DMenu.super_DObject._vptr_DObject[8])(this,6,1);
        if ((char)iVar2 != '\0') {
          return true;
        }
      }
      goto LAB_0033514d;
    }
  }
  this->Selected = -1;
LAB_0033514d:
  bVar1 = DListMenu::MouseEvent(&this->super_DListMenu,type,x,y);
  return bVar1;
}

Assistant:

bool DLoadSaveMenu::MouseEvent(int type, int x, int y)
{
	if (x >= listboxLeft && x < listboxLeft + listboxWidth && 
		y >= listboxTop && y < listboxTop + listboxHeight)
	{
		int lineno = (y - listboxTop) / rowHeight;

		if (TopItem + lineno < (int)SaveGames.Size())
		{
			Selected = TopItem + lineno;
			UnloadSaveData ();
			ExtractSaveData (Selected);
			if (type == MOUSE_Release)
			{
				if (MenuEvent(MKEY_Enter, true))
				{
					return true;
				}
			}
		}
		else Selected = -1;
	}
	else Selected = -1;

	return Super::MouseEvent(type, x, y);
}